

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

bool pstore::operator==(small_vector<unsigned_char,_128UL> *lhs,
                       small_vector<unsigned_char,_128UL> *rhs)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t sVar3;
  difference_type __d1;
  size_t sVar4;
  
  sVar3 = lhs->elements_;
  if (sVar3 == rhs->elements_) {
    if (sVar3 == 0) {
      return sVar3 == 0;
    }
    if (*lhs->buffer_ == *rhs->buffer_) {
      sVar4 = 1;
      do {
        if (sVar3 == sVar4) {
          return sVar3 == sVar4;
        }
        puVar1 = lhs->buffer_ + sVar4;
        puVar2 = rhs->buffer_ + sVar4;
        sVar4 = sVar4 + 1;
      } while (*puVar1 == *puVar2);
    }
  }
  return false;
}

Assistant:

const_iterator end () const noexcept { return const_iterator{buffer_ + elements_}; }